

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O0

int advance_view(void)

{
  int cycled;
  
  cycled = 0;
  viewnum = viewnum + 1;
  if (0x19 < viewnum) {
    viewnum = 0;
    cycled = -1;
  }
  return cycled;
}

Assistant:

int advance_view()
{
   int cycled = FALSE;

   viewnum++;

   if (viewnum >= (int)(sizeof(viewpos)/sizeof(VIEWPOS))) {
      viewnum = 0;
      cycled = TRUE;
   }

   return cycled;
}